

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergePartialFromCodedStream
          (CustomModel_CustomModelParamValue *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  char *data;
  string *psVar5;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  CustomModel_CustomModelParamValue *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_003f322b:
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_003f33aa;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_003f33aa:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto LAB_003f3637;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 10:
      if ((tag_00 & 0xff) == 0x51) {
        clear_value(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&(this->value_).doublevalue_);
        if (!bVar1) {
          return false;
        }
        set_has_doublevalue(this);
        goto LAB_003f322b;
      }
      break;
    default:
      break;
    case 0x14:
      if ((tag_00 & 0xff) != 0xa2) break;
      psVar5 = mutable_stringvalue_abi_cxx11_(this);
      bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
      if (!bVar1) {
        return false;
      }
      stringvalue_abi_cxx11_(this);
      data = (char *)std::__cxx11::string::data();
      stringvalue_abi_cxx11_(this);
      iVar2 = std::__cxx11::string::length();
      bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,iVar2,PARSE,
                         "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
      goto joined_r0x003f362b;
    case 0x1e:
      if ((tag_00 & 0xff) == 0xf0) {
        clear_value(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&(this->value_).intvalue_);
        if (!bVar1) {
          return false;
        }
        set_has_intvalue(this);
        goto LAB_003f322b;
      }
      break;
    case 0x28:
      if ((tag_00 & 0xff) == 0x40) {
        clear_value(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&(this->value_).longvalue_);
        if (!bVar1) {
          return false;
        }
        set_has_longvalue(this);
        goto LAB_003f322b;
      }
      break;
    case 0x32:
      if ((tag_00 & 0xff) == 0x90) {
        clear_value(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&(this->value_).boolvalue_);
        if (!bVar1) {
          return false;
        }
        set_has_boolvalue(this);
        goto LAB_003f322b;
      }
      break;
    case 0x3c:
      if ((tag_00 & 0xff) == 0xe2) {
        psVar5 = mutable_bytesvalue_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar5);
        goto joined_r0x003f362b;
      }
    }
LAB_003f3637:
    if ((tag_00 == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
joined_r0x003f362b:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool CustomModel_CustomModelParamValue::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double doubleValue = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(81u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &value_.doublevalue_)));
          set_has_doublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string stringValue = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_stringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->stringvalue().data(), this->stringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intValue = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(240u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &value_.intvalue_)));
          set_has_intvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 longValue = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &value_.longvalue_)));
          set_has_longvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool boolValue = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &value_.boolvalue_)));
          set_has_boolvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes bytesValue = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_bytesvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomModel.CustomModelParamValue)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomModel.CustomModelParamValue)
  return false;
#undef DO_
}